

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

void __thiscall pm::Sampler::resize(Sampler *this,uint numSamples)

{
  uint numSamples_local;
  Sampler *this_local;
  
  this->numSamples_ = numSamples;
  std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::clear(&this->samples_);
  std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::clear(&this->diskSamples_);
  std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::clear(&this->hemisphereSamples_);
  std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::reserve
            (&this->samples_,(ulong)(this->numSamples_ * this->numSets_));
  (*this->_vptr_Sampler[2])();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->shuffledIndices_);
  setupShuffleIndices(this);
  mapSamplesToDisk(this);
  return;
}

Assistant:

void Sampler::resize(unsigned int numSamples)
{
	// Set the new number first as some methods will use it internally
	numSamples_ = numSamples;

	samples_.clear();
	diskSamples_.clear();
	hemisphereSamples_.clear();

	samples_.reserve(numSamples_ * numSets_);
	generateSamples();

	shuffledIndices_.clear();
	setupShuffleIndices();

	mapSamplesToDisk();
}